

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O2

void __thiscall
jaegertracing::reporters::Config::Config
          (Config *this,int queueSize,duration *bufferFlushInterval,bool logSpans,
          string *localAgentHostPort,string *endpoint)

{
  int iVar1;
  long lVar2;
  allocator local_19;
  
  iVar1 = 100;
  if (0 < queueSize) {
    iVar1 = queueSize;
  }
  this->_queueSize = iVar1;
  lVar2 = 10000000000;
  if (0 < bufferFlushInterval->__r) {
    lVar2 = bufferFlushInterval->__r;
  }
  (this->_bufferFlushInterval).__r = lVar2;
  this->_logSpans = logSpans;
  if (localAgentHostPort->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&this->_localAgentHostPort,"127.0.0.1:6831",&local_19);
  }
  else {
    std::__cxx11::string::string((string *)&this->_localAgentHostPort,(string *)localAgentHostPort);
  }
  std::__cxx11::string::string((string *)&this->_endpoint,(string *)endpoint);
  return;
}

Assistant:

explicit Config(
        int queueSize = kDefaultQueueSize,
        const Clock::duration& bufferFlushInterval =
            defaultBufferFlushInterval(),
        bool logSpans = false,
        const std::string& localAgentHostPort = kDefaultLocalAgentHostPort, const std::string& endpoint = kDefaultEndpoint)
        : _queueSize(queueSize > 0 ? queueSize : kDefaultQueueSize)
        , _bufferFlushInterval(bufferFlushInterval.count() > 0
                                   ? bufferFlushInterval
                                   : defaultBufferFlushInterval())
        , _logSpans(logSpans)
        , _localAgentHostPort(localAgentHostPort.empty()
                                  ? kDefaultLocalAgentHostPort
                                  : localAgentHostPort)
        , _endpoint(endpoint)
    {
    }